

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

void __thiscall Clasp::BasicSolve::reset(BasicSolve *this,bool reinit)

{
  byte in_SIL;
  long in_RDI;
  SolveParams *in_stack_00000140;
  Solver *in_stack_00000148;
  State *in_stack_00000150;
  State *in_stack_ffffffffffffffe0;
  State *this_00;
  
  if ((*(long *)(in_RDI + 0x20) == 0) || ((in_SIL & 1) != 0)) {
    this_00 = *(State **)(in_RDI + 0x20);
    if (this_00 != (State *)0x0) {
      State::~State(this_00);
      operator_delete(this_00);
    }
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else {
    State::~State(in_stack_ffffffffffffffe0);
    State::State(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  }
  return;
}

Assistant:

void BasicSolve::reset(bool reinit) {
	if (!state_ || reinit) {
		delete state_;
		state_ = 0;
	}
	else {
		state_->~State();
		new (state_) State(*solver_, *params_);
	}
}